

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O1

uint32_t aom_rb_read_unsigned_literal(aom_read_bit_buffer *rb,int bits)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  
  if (bits < 1) {
    uVar3 = 0;
  }
  else {
    iVar2 = bits + 1;
    uVar3 = 0;
    do {
      iVar1 = aom_rb_read_bit(rb);
      uVar3 = uVar3 | iVar1 << ((char)iVar2 - 2U & 0x1f);
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return uVar3;
}

Assistant:

uint32_t aom_rb_read_unsigned_literal(struct aom_read_bit_buffer *rb,
                                      int bits) {
  assert(bits <= 32);
  uint32_t value = 0;
  int bit;
  for (bit = bits - 1; bit >= 0; bit--)
    value |= (uint32_t)aom_rb_read_bit(rb) << bit;
  return value;
}